

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct2.cpp
# Opt level: O0

int main(void)

{
  graph lat;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> boundary;
  span_t span;
  unitcell unitcell;
  basis basis;
  basis_t bs;
  size_t in_stack_fffffffffffffe68;
  unitcell *in_stack_fffffffffffffe70;
  graph *this;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *in_stack_fffffffffffffe80;
  basis_t *in_stack_fffffffffffffe88;
  basis *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffed4;
  ostream *in_stack_fffffffffffffed8;
  graph *in_stack_fffffffffffffee0;
  int in_stack_ffffffffffffff04;
  offset_t *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  unitcell *in_stack_ffffffffffffff20;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *in_stack_ffffffffffffff30;
  span_t *in_stack_ffffffffffffff38;
  unitcell *in_stack_ffffffffffffff40;
  basis *in_stack_ffffffffffffff48;
  graph *in_stack_ffffffffffffff50;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_18 [24];
  
  this_00 = local_18;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (&in_stack_fffffffffffffe90->basis_,(int *)in_stack_fffffffffffffe88,
             (int *)in_stack_fffffffffffffe80);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (this_00,(Scalar *)in_stack_fffffffffffffe70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x10257a);
  lattice::basis::basis(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  lattice::unitcell::unitcell(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  lattice::coordinate(in_stack_fffffffffffffea8);
  lattice::unitcell::add_site
            ((unitcell *)in_stack_fffffffffffffee0,(coordinate_t *)in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed4);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1025dd);
  lattice::offset((long)in_stack_fffffffffffffea8);
  lattice::unitcell::add_bond
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             ,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x10261e);
  Eigen::Matrix<long,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<long,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe90,
             (int *)in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80);
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::operator<<
            ((DenseBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)this_00,
             (Scalar *)in_stack_fffffffffffffe70);
  Eigen::CommaInitializer<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)0x10268b);
  this = (graph *)&stack0xfffffffffffffed3;
  std::allocator<lattice::boundary_t>::allocator((allocator<lattice::boundary_t> *)0x1026a2);
  std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::vector
            ((vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *)
             in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88,
             (value_type *)in_stack_fffffffffffffe80,(allocator_type *)this_00);
  std::allocator<lattice::boundary_t>::~allocator((allocator<lattice::boundary_t> *)0x1026c7);
  lattice::graph::graph
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  lattice::graph::print(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  lattice::graph::~graph(this);
  std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::~vector
            (in_stack_fffffffffffffe80);
  Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<long,__1,__1,_0,__1,__1> *)0x102724);
  lattice::unitcell::~unitcell((unitcell *)this);
  lattice::basis::~basis((basis *)0x10273e);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x10274b);
  return 0;
}

Assistant:

int main() {
  lattice::basis_t bs(1, 1); bs << 1; // 1x1 matrix
  lattice::basis basis(bs);
  lattice::unitcell unitcell(1);
  unitcell.add_site(lattice::coordinate(0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1), 0);
  lattice::span_t span(1, 1); span << 16; // 1x1 matrix
  std::vector<lattice::boundary_t> boundary(1, lattice::boundary_t::periodic);
  lattice::graph lat(basis, unitcell, span, boundary);
  lat.print(std::cout);
}